

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_CURE(effect_handler_context_t_conflict *context)

{
  byte can_disturb;
  
  can_disturb = true;
  if ((context->origin).what == SRC_PLAYER) {
    can_disturb = context->aware ^ 1;
  }
  player_clear_timed(player,context->subtype,true,(_Bool)can_disturb);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_CURE(effect_handler_context_t *context)
{
	int type = context->subtype;
	(void) player_clear_timed(player, type, true,
		context->origin.what != SRC_PLAYER || !context->aware);
	context->ident = true;
	return true;
}